

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::FieldBase::encodeTo(FieldBase *this,string *result)

{
  int iVar1;
  size_t len;
  long lVar2;
  char *buf_00;
  void *__src;
  size_t __n;
  char *buf;
  size_t totalLength;
  size_t tagLength;
  string *result_local;
  FieldBase *this_local;
  
  iVar1 = number_of_symbols_in(this->m_tag);
  len = (size_t)iVar1;
  lVar2 = std::__cxx11::string::length();
  std::__cxx11::string::resize((ulong)result);
  buf_00 = (char *)std::__cxx11::string::c_str();
  integer_to_string(buf_00,len,this->m_tag);
  buf_00[len] = '=';
  __src = (void *)std::__cxx11::string::data();
  __n = std::__cxx11::string::length();
  memcpy(buf_00 + len + 1,__src,__n);
  buf_00[len + lVar2 + 1] = '\x01';
  return;
}

Assistant:

void encodeTo( std::string& result ) const
  {
    size_t tagLength = FIX::number_of_symbols_in( m_tag );
    size_t totalLength = tagLength + m_string.length() + 2;

    result.resize( totalLength );

    char * buf = (char*)result.c_str();
    FIX::integer_to_string( buf, tagLength, m_tag );

    buf[tagLength] = '=';
    memcpy( buf + tagLength + 1, m_string.data(), m_string.length() );
    buf[totalLength - 1] = '\001';
  }